

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  size_t sVar1;
  size_t sVar2;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  st_ptls_traffic_protection_t *local_40;
  size_t chunk_size;
  st_ptls_traffic_protection_t *psStack_30;
  int ret;
  st_ptls_traffic_protection_t *enc_local;
  size_t len_local;
  uint8_t *src_local;
  ptls_buffer_t *ppStack_10;
  uint8_t type_local;
  ptls_buffer_t *buf_local;
  
  chunk_size._4_4_ = 0;
  psStack_30 = enc;
  enc_local = (st_ptls_traffic_protection_t *)len;
  len_local = (size_t)src;
  src_local._7_1_ = type;
  ppStack_10 = buf;
  while( true ) {
    if (enc_local == (st_ptls_traffic_protection_t *)0x0) {
      return chunk_size._4_4_;
    }
    local_40 = enc_local;
    if ((st_ptls_traffic_protection_t *)0x4000 < enc_local) {
      local_40 = (st_ptls_traffic_protection_t *)0x4000;
    }
    capacity._5_1_ = 0x17;
    capacity._6_1_ = 3;
    capacity._7_1_ = 3;
    chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,(void *)((long)&capacity + 5),3);
    if (chunk_size._4_4_ != 0) {
      return chunk_size._4_4_;
    }
    body_start = 2;
    chunk_size._4_4_ = ptls_buffer__do_pushv(ppStack_10,"",2);
    if (chunk_size._4_4_ != 0) {
      return chunk_size._4_4_;
    }
    sVar1 = ppStack_10->off;
    chunk_size._4_4_ =
         ptls_buffer_reserve(ppStack_10,
                             (size_t)(local_40->secret + psStack_30->aead->algo->tag_size + 1));
    if (chunk_size._4_4_ != 0) break;
    sVar2 = aead_encrypt(psStack_30,ppStack_10->base + ppStack_10->off,(void *)len_local,
                         (size_t)local_40,src_local._7_1_);
    ppStack_10->off = sVar2 + ppStack_10->off;
    sVar2 = ppStack_10->off;
    for (; body_start != 0; body_start = body_start - 1) {
      ppStack_10->base[sVar1 - body_start] =
           (uint8_t)(sVar2 - sVar1 >> (((char)body_start + -1) * '\b' & 0x3fU));
    }
    len_local = (size_t)(local_40->secret + len_local);
    enc_local = (st_ptls_traffic_protection_t *)((long)enc_local - (long)local_40);
  }
  return chunk_size._4_4_;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(buf, chunk_size + enc->aead->algo->tag_size + 1)) != 0)
                goto Exit;
            buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
        });
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}